

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void av1_collect_motion_search_features_sb
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int mi_row,int mi_col,
               BLOCK_SIZE bsize,aom_partition_features_t *features)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined1 *memblk;
  ulong uVar6;
  void *memblk_00;
  uint *best_var;
  FILE *__stream;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  undefined1 *puVar13;
  int iVar14;
  SIMPLE_MOTION_DATA_TREE *sms_root;
  uint *puVar15;
  undefined1 *puVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  size_t sVar21;
  int iVar22;
  undefined1 *puVar23;
  void *pvVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  SIMPLE_MOTION_DATA_TREE *tree;
  int ref_list [1];
  char local_138 [264];
  
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
      bVar25 = false;
    }
    else {
      bVar25 = cpi->compressor_stage != '\x01';
    }
    sVar21 = 1;
    if (bVar25) {
      sVar21 = (ulong)(((cpi->common).seq_params)->sb_size == BLOCK_128X128) << 10 | 0x155;
    }
    memblk = (undefined1 *)aom_calloc(sVar21,0x78);
    if (memblk == (undefined1 *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate sms_tree");
    }
    if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
      bVar25 = false;
    }
    else {
      bVar25 = cpi->compressor_stage != '\x01';
    }
    BVar1 = ((cpi->common).seq_params)->sb_size;
    if (bVar25) {
      uVar6 = (ulong)(BVar1 == BLOCK_128X128) << 10 | 0x155;
      uVar9 = 0x100;
      if (BVar1 == BLOCK_128X128) {
        uVar9 = 0x400;
      }
      uVar12 = 0;
      puVar16 = memblk;
      do {
        *puVar16 = 0;
        uVar12 = uVar12 + 1;
        puVar16 = puVar16 + 0x78;
      } while (uVar9 != uVar12);
      lVar17 = 1;
      puVar16 = memblk;
      do {
        uVar18 = (uint)uVar9;
        if (3 < uVar18) {
          BVar1 = square[lVar17];
          uVar12 = uVar12 & 0xffffffff;
          puVar13 = memblk + uVar12 * 0x78 + 8;
          iVar14 = 0;
          puVar23 = puVar16;
          do {
            memblk[uVar12 * 0x78] = BVar1;
            puVar16 = puVar23 + 0x1e0;
            lVar19 = 0;
            do {
              auVar26._8_4_ = (int)puVar23;
              auVar26._0_8_ = puVar23;
              auVar26._12_4_ = (int)((ulong)puVar23 >> 0x20);
              *(undefined1 **)(puVar13 + lVar19 * 8) = puVar23;
              *(long *)((long)(puVar13 + lVar19 * 8) + 8) = auVar26._8_8_ + 0x78;
              lVar19 = lVar19 + 2;
              puVar23 = puVar23 + 0xf0;
            } while (lVar19 != 4);
            uVar12 = uVar12 + 1;
            iVar14 = iVar14 + 1;
            puVar13 = puVar13 + 0x78;
            puVar23 = puVar16;
          } while (iVar14 != (int)(uVar9 >> 2));
        }
        lVar17 = lVar17 + 1;
        uVar9 = uVar9 >> 2;
      } while (0xf < uVar18);
    }
    else {
      *memblk = 6;
      uVar6 = 1;
    }
    sms_root = (SIMPLE_MOTION_DATA_TREE *)(memblk + uVar6 * 0x78 + -0x78);
    uVar9 = (ulong)bsize;
    av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
    uVar6 = 0;
    uVar18 = mi_row;
    av1_init_simple_motion_search_mvs_for_sb(cpi,(TileInfo *)0x0,&td->mb,sms_root,mi_row,mi_col);
    av1_reset_simple_motion_tree_partition(sms_root,bsize);
    ref_list[0] = 7;
    if ((cpi->rc).is_src_frame_alt_ref == 0) {
      ref_list[0] = 1;
    }
    uVar4 = (cpi->common).mi_params.mi_cols - mi_col;
    uVar7 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [uVar9];
    if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar9] <= (int)uVar4) {
      uVar4 = uVar7;
    }
    bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar9];
    uVar8 = (cpi->common).mi_params.mi_rows - mi_row;
    if ((int)(uint)bVar2 <= (int)uVar8) {
      uVar8 = (uint)bVar2;
    }
    uVar10 = uVar4 + 3;
    if (-1 < (int)uVar4) {
      uVar10 = uVar4;
    }
    uVar5 = uVar8 + 3;
    if (-1 < (int)uVar8) {
      uVar5 = uVar8;
    }
    sVar21 = (size_t)(int)(((uint)(0 < (int)(uVar8 & 0x80000003)) + ((int)uVar5 >> 2)) *
                          ((uint)(0 < (int)(uVar4 & 0x80000003)) + ((int)uVar10 >> 2)));
    memblk_00 = aom_calloc(sVar21,4);
    best_var = (uint *)aom_calloc(sVar21,4);
    if (memblk_00 == (void *)0x0 || best_var == (uint *)0x0) {
      aom_free(memblk);
      aom_free(memblk_00);
      aom_free(best_var);
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Error allocating block_sse & block_var");
    }
    iVar22 = bVar2 + uVar18;
    iVar14 = (cpi->common).mi_params.mi_rows;
    if (iVar22 < iVar14) {
      iVar14 = iVar22;
    }
    uVar4 = uVar18;
    if ((int)uVar18 < iVar14) {
      iVar11 = uVar7 + mi_col;
      uVar6 = 0;
      iVar14 = iVar11;
      do {
        iVar20 = (cpi->common).mi_params.mi_cols;
        if (iVar11 < iVar20) {
          iVar20 = iVar11;
        }
        if (mi_col < iVar20) {
          pvVar24 = (void *)((long)memblk_00 + (long)(int)uVar6 * 4);
          puVar15 = best_var + (int)uVar6;
          iVar20 = mi_col;
          iVar11 = iVar14;
          do {
            simple_motion_search_get_best_ref
                      (cpi,&td->mb,sms_root,uVar18,iVar20,BLOCK_16X16,ref_list,1,(int)pvVar24,
                       (int)puVar15,(uint *)CONCAT44(iVar11,uVar4),best_var);
            iVar20 = iVar20 + 4;
            iVar3 = (cpi->common).mi_params.mi_cols;
            if (iVar11 < iVar3) {
              iVar3 = iVar11;
            }
            pvVar24 = (void *)((long)pvVar24 + 4);
            puVar15 = puVar15 + 1;
            uVar6 = (ulong)((int)uVar6 + 1);
            iVar14 = iVar11;
          } while (iVar20 < iVar3);
        }
        uVar18 = uVar18 + 4;
        iVar20 = (cpi->common).mi_params.mi_rows;
        if (iVar22 < iVar20) {
          iVar20 = iVar22;
        }
      } while ((int)uVar18 < iVar20);
    }
    iVar14 = (int)uVar6;
    if (features == (aom_partition_features_t *)0x0) {
      snprintf(local_138,0x100,"%s/motion_search_feature_sb%d",(cpi->oxcf).partition_info_path,
               (ulong)(uint)cpi->sb_counter);
      __stream = fopen64(local_138,"w");
      fprintf(__stream,"%d,%d,%d,%d,%d\n",(ulong)uVar4,(ulong)(uint)mi_col,uVar9,0x10,uVar6);
      if (iVar14 < 1) {
        fputc(10,__stream);
      }
      else {
        uVar9 = 0;
        do {
          fprintf(__stream,"%d",(ulong)*(uint *)((long)memblk_00 + uVar9 * 4));
          if ((long)uVar9 < (long)(iVar14 + -1)) {
            fputc(0x2c,__stream);
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        fputc(10,__stream);
        if (0 < iVar14) {
          uVar9 = 0;
          do {
            fprintf(__stream,"%d",(ulong)best_var[uVar9]);
            if ((long)uVar9 < (long)(iVar14 + -1)) {
              fputc(0x2c,__stream);
            }
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
      }
      fputc(10,__stream);
      fclose(__stream);
    }
    else {
      (features->sb_features).motion_features.unit_length = 0x10;
      (features->sb_features).motion_features.num_units = iVar14;
      if (0 < iVar14) {
        uVar9 = 0;
        do {
          (features->sb_features).motion_features.block_sse[uVar9] =
               *(int *)((long)memblk_00 + uVar9 * 4);
          (features->sb_features).motion_features.block_var[uVar9] = best_var[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
    }
    aom_free(memblk_00);
    aom_free(best_var);
    aom_free(memblk);
  }
  return;
}

Assistant:

void av1_collect_motion_search_features_sb(AV1_COMP *const cpi, ThreadData *td,
                                           TileDataEnc *tile_data,
                                           const int mi_row, const int mi_col,
                                           const BLOCK_SIZE bsize,
                                           aom_partition_features_t *features) {
  const AV1_COMMON *const cm = &cpi->common;
  if (frame_is_intra_only(cm)) return;

  MACROBLOCK *const x = &td->mb;
  const BLOCK_SIZE fixed_block_size = BLOCK_16X16;
  const int col_step = mi_size_wide[fixed_block_size];
  const int row_step = mi_size_high[fixed_block_size];
  SIMPLE_MOTION_DATA_TREE *sms_tree = NULL;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  CHECK_MEM_ERROR(cm, sms_tree, aom_calloc(tree_nodes, sizeof(*sms_tree)));
  SIMPLE_MOTION_DATA_TREE *sms_root = setup_sms_tree(cpi, sms_tree);
  TileInfo *const tile_info = &tile_data->tile_info;
  av1_set_offsets_without_segment_id(cpi, tile_info, x, mi_row, mi_col, bsize);
  av1_init_simple_motion_search_mvs_for_sb(cpi, NULL, x, sms_root, mi_row,
                                           mi_col);
  av1_reset_simple_motion_tree_partition(sms_root, bsize);
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int mi_width =
      AOMMIN(mi_size_wide[bsize], cm->mi_params.mi_cols - mi_col);
  const int mi_height =
      AOMMIN(mi_size_high[bsize], cm->mi_params.mi_rows - mi_row);
  const int col_steps = (mi_width / col_step) + ((mi_width % col_step) > 0);
  const int row_steps = (mi_height / row_step) + ((mi_height % row_step) > 0);
  const int num_blocks = col_steps * row_steps;
  unsigned int *block_sse = aom_calloc(num_blocks, sizeof(*block_sse));
  unsigned int *block_var = aom_calloc(num_blocks, sizeof(*block_var));
  if (!(block_sse && block_var)) {
    aom_free(sms_tree);
    aom_free(block_sse);
    aom_free(block_var);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Error allocating block_sse & block_var");
  }
  int idx = 0;

  for (int row = mi_row;
       row < AOMMIN(mi_row + mi_size_high[bsize], cm->mi_params.mi_rows);
       row += row_step) {
    for (int col = mi_col;
         col < AOMMIN(mi_col + mi_size_wide[bsize], cm->mi_params.mi_cols);
         col += col_step) {
      simple_motion_search_get_best_ref(
          cpi, x, sms_root, row, col, fixed_block_size, ref_list,
          /*num_refs=*/1, /*use_subpixel=*/1,
          /*save_mv=*/1, &block_sse[idx], &block_var[idx]);
      ++idx;
    }
  }
  if (features == NULL) {
    write_motion_feature_to_file(cpi->oxcf.partition_info_path, cpi->sb_counter,
                                 block_sse, block_var, idx, bsize,
                                 fixed_block_size, mi_row, mi_col);
  } else {
    features->sb_features.motion_features.unit_length =
        block_size_wide[fixed_block_size];
    features->sb_features.motion_features.num_units = idx;
    for (int i = 0; i < idx; ++i) {
      features->sb_features.motion_features.block_sse[i] = block_sse[i];
      features->sb_features.motion_features.block_var[i] = block_var[i];
    }
  }

  aom_free(block_sse);
  aom_free(block_var);
  aom_free(sms_tree);
}